

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

int OPENSSL_vasprintf_internal(char **str,char *format,__va_list_tag *args,int system_malloc)

{
  char *__s;
  int *piVar1;
  code *local_98;
  code *local_90;
  code *local_88;
  char *tmp;
  va_list args_copy;
  size_t sStack_58;
  int ret;
  size_t candidate_len;
  char *candidate;
  _func_void_ptr_void_ptr_size_t *reallocate;
  _func_void_void_ptr *deallocate;
  _func_void_ptr_size_t *allocate;
  int system_malloc_local;
  __va_list_tag *args_local;
  char *format_local;
  char **str_local;
  
  if (system_malloc == 0) {
    local_88 = OPENSSL_malloc;
    local_90 = OPENSSL_free;
    local_98 = OPENSSL_realloc;
  }
  else {
    local_88 = malloc;
    local_90 = free;
    local_98 = realloc;
  }
  sStack_58 = 0x40;
  __s = (char *)(*local_88)(0x40);
  if (__s != (char *)0x0) {
    args_copy[0].overflow_arg_area = args->reg_save_area;
    tmp = *(char **)args;
    args_copy[0]._0_8_ = args->overflow_arg_area;
    args_copy[0].reg_save_area._4_4_ = vsnprintf(__s,0x40,format,&tmp);
    if (-1 < (int)args_copy[0].reg_save_area._4_4_) {
      candidate_len = (size_t)__s;
      if (0x3f < args_copy[0].reg_save_area._4_4_) {
        sStack_58 = (long)(int)args_copy[0].reg_save_area._4_4_ + 1;
        candidate_len = (*local_98)(__s,sStack_58);
        if ((char *)candidate_len == (char *)0x0) goto LAB_0022975c;
        args_copy[0].reg_save_area._4_4_ = vsnprintf((char *)candidate_len,sStack_58,format,args);
      }
      __s = (char *)candidate_len;
      if ((-1 < (int)args_copy[0].reg_save_area._4_4_) &&
         ((ulong)(long)(int)args_copy[0].reg_save_area._4_4_ < sStack_58)) {
        *str = (char *)candidate_len;
        return args_copy[0].reg_save_area._4_4_;
      }
    }
  }
LAB_0022975c:
  candidate_len = (size_t)__s;
  (*local_90)(candidate_len);
  *str = (char *)0x0;
  piVar1 = __errno_location();
  *piVar1 = 0xc;
  return -1;
}

Assistant:

int OPENSSL_vasprintf_internal(char **str, const char *format, va_list args,
                               int system_malloc) {
  void *(*allocate)(size_t) = system_malloc ? malloc : OPENSSL_malloc;
  void (*deallocate)(void *) = system_malloc ? free : OPENSSL_free;
  void *(*reallocate)(void *, size_t) =
      system_malloc ? realloc : OPENSSL_realloc;
  char *candidate = NULL;
  size_t candidate_len = 64;  // TODO(bbe) what's the best initial size?
  int ret;

  if ((candidate = reinterpret_cast<char *>(allocate(candidate_len))) == NULL) {
    goto err;
  }
  va_list args_copy;
  va_copy(args_copy, args);
  ret = vsnprintf(candidate, candidate_len, format, args_copy);
  va_end(args_copy);
  if (ret < 0) {
    goto err;
  }
  if ((size_t)ret >= candidate_len) {
    // Too big to fit in allocation.
    char *tmp;

    candidate_len = (size_t)ret + 1;
    if ((tmp = reinterpret_cast<char *>(
             reallocate(candidate, candidate_len))) == NULL) {
      goto err;
    }
    candidate = tmp;
    ret = vsnprintf(candidate, candidate_len, format, args);
  }
  // At this point this should not happen unless vsnprintf is insane.
  if (ret < 0 || (size_t)ret >= candidate_len) {
    goto err;
  }
  *str = candidate;
  return ret;

err:
  deallocate(candidate);
  *str = NULL;
  errno = ENOMEM;
  return -1;
}